

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float128 float128_scalbn_arm(float128 a,int n,float_status *status)

{
  uint64_t zSig0;
  int iVar1;
  uint uVar2;
  uint64_t zSig1;
  int iVar3;
  float128 fVar4;
  
  zSig1 = a.low;
  zSig0 = a.high & 0xffffffffffff;
  uVar2 = a.high._6_2_ & 0x7fff;
  if (((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
    uVar2 = 1;
    if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
        zSig1 == 0) {
      return a;
    }
  }
  else {
    if (uVar2 == 0x7fff) {
      if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
          zSig1 == 0) {
        return a;
      }
      fVar4 = propagateFloat128NaN(a,a,status);
      return fVar4;
    }
    zSig0 = zSig0 + 0x1000000000000;
  }
  iVar3 = -0x10000;
  if (-0x10000 < n) {
    iVar3 = n;
  }
  iVar1 = 0xffff;
  if (n < 0x10001) {
    iVar1 = iVar3 + -1;
  }
  fVar4 = normalizeRoundAndPackFloat128(a.high._7_1_ >> 7,iVar1 + uVar2,zSig0,zSig1,status);
  return fVar4;
}

Assistant:

float128 float128_scalbn(float128 a, int n, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig0, aSig1;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    if ( aExp == 0x7FFF ) {
        if ( aSig0 | aSig1 ) {
            return propagateFloat128NaN(a, a, status);
        }
        return a;
    }
    if (aExp != 0) {
        aSig0 |= UINT64_C(0x0001000000000000);
    } else if (aSig0 == 0 && aSig1 == 0) {
        return a;
    } else {
        aExp++;
    }

    if (n > 0x10000) {
        n = 0x10000;
    } else if (n < -0x10000) {
        n = -0x10000;
    }

    aExp += n - 1;
    return normalizeRoundAndPackFloat128( aSign, aExp, aSig0, aSig1
                                         , status);

}